

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O2

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,uint16_t type,sockaddr *addr)

{
  ushort uVar1;
  int iVar2;
  uint8_t *begin;
  
  uVar1 = msg_hdr->length;
  iVar2 = stun_attr_xor_sockaddr_init
                    ((stun_attr_xor_sockaddr *)
                     (msg_hdr[1].tsx_id + ((ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) - 8)),type,addr,
                     msg_hdr);
  if (iVar2 == 0) {
    stun_msg_add_attr(msg_hdr,(stun_attr_hdr *)
                              (msg_hdr[1].tsx_id + ((ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) - 8)));
  }
  return iVar2;
}

Assistant:

int stun_attr_xor_sockaddr_add(stun_msg_hdr *msg_hdr,
                               uint16_t type, const struct sockaddr *addr) {
  stun_attr_xor_sockaddr *attr =
      (stun_attr_xor_sockaddr *)stun_msg_end(msg_hdr);
  int status = stun_attr_xor_sockaddr_init(attr, type, addr, msg_hdr);
  if (status != STUN_OK)
    return status;
  stun_msg_add_attr(msg_hdr, &attr->hdr);
  return STUN_OK;
}